

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LiteralType.cc
# Opt level: O2

bool flow::isArrayType(LiteralType type)

{
  return type - IntArray < 4;
}

Assistant:

bool isArrayType(LiteralType type) {
  switch (type) {
    case LiteralType::IntArray:
    case LiteralType::StringArray:
    case LiteralType::IPAddrArray:
    case LiteralType::CidrArray:
      return true;
    default:
      return false;
  }
}